

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

void CallMission(char *str)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  int local_14;
  char *pcStack_10;
  int CurLbl;
  char *str_local;
  
  local_14 = -1;
  pcStack_10 = str;
  EnterCriticalSection(&MissionFilesCS);
  if (bMissionRunning == 0) {
    memset(labels,0,0x1000);
    memset(procdefineaddrs,0,0x400);
    memset(procreturnaddrs,0,0x400);
    memset(procstackids,0,0x400);
    procstack = 0;
    missionfile = (FILE *)fopen(pcStack_10,"r");
    if ((FILE *)missionfile == (FILE *)0x0) {
      printf("Mission file not found.\n");
    }
    else {
      EnterCriticalSection(&strtimeCS);
      pcVar2 = strtimeex_fns();
      sprintf(logmissionfilename,"log/logmission_%.64s.csv",pcVar2);
      LeaveCriticalSection(&strtimeCS);
      logmissionfile = (FILE *)fopen(logmissionfilename,"w");
      if ((FILE *)logmissionfile == (FILE *)0x0) {
        printf("Unable to create log file.\n");
      }
      else {
        fprintf((FILE *)logmissionfile,
                "%% Time (in s); Lat (in deg); Long (in deg); Depth (in m); Action;\n");
        fflush((FILE *)logmissionfile);
      }
      if ((((bMissionPaused != 0) || (AutoResumeMissionMode == 1)) ||
          ((AutoResumeMissionMode == 2 && (bMissionAtStartup != 0)))) &&
         ((pFVar3 = fopen("log/CurLbl.txt","r"), pFVar3 != (FILE *)0x0 &&
          (iVar1 = GetCurrentLabelEx("log/CurLbl.txt",&local_14), iVar1 == 0)))) {
        printf("Resuming mission...\n");
        GotoMission(local_14);
      }
      StartChrono(&chrono_mission);
      printf("Mission started.\n");
      bMissionRunning = 1;
    }
  }
  else {
    printf("A mission is already running.\n");
  }
  bMissionPaused = 0;
  LeaveCriticalSection(&MissionFilesCS);
  return;
}

Assistant:

inline void CallMission(char* str)
{
	int CurLbl = -1;

	EnterCriticalSection(&MissionFilesCS);
	if (!bMissionRunning)
	{
		memset(labels, 0, sizeof(labels));
		memset(procdefineaddrs, 0, sizeof(procdefineaddrs));
		memset(procreturnaddrs, 0, sizeof(procreturnaddrs));
		memset(procstackids, 0, sizeof(procstackids));
		procstack = 0;
		missionfile = fopen(str, "r");
		if (missionfile == NULL)
		{
			printf("Mission file not found.\n");
		}
		else
		{
			EnterCriticalSection(&strtimeCS);
			sprintf(logmissionfilename, LOG_FOLDER"logmission_%.64s.csv", strtimeex_fns());
			LeaveCriticalSection(&strtimeCS);
			logmissionfile = fopen(logmissionfilename, "w");
			if (logmissionfile == NULL)
			{
				printf("Unable to create log file.\n");
			}
			else
			{
				fprintf(logmissionfile, 
					"%% Time (in s); Lat (in deg); Long (in deg); Depth (in m); Action;\n"
					); 
				fflush(logmissionfile);
			}
			if ((bMissionPaused)||(AutoResumeMissionMode == MISSION_RESUME_NEXT)||((AutoResumeMissionMode == MISSION_RESUME_STARTUP)&&(bMissionAtStartup)))
			{
				if ((fopen(LOG_FOLDER"CurLbl.txt", "r"))&&(GetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", &CurLbl) == EXIT_SUCCESS))
				{
					printf("Resuming mission...\n");
					GotoMission(CurLbl);
				}
			}
			StartChrono(&chrono_mission);
			printf("Mission started.\n");
			bMissionRunning = TRUE;
		}
	}
	else
	{
		printf("A mission is already running.\n");
	}
	bMissionPaused = FALSE;
	LeaveCriticalSection(&MissionFilesCS);
}